

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::getBoundViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  uint uVar1;
  pointer pdVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  bVar3 = isPrimalFeasible(this);
  if (bVar3) {
    _syncRealSolution(this);
    *maxviol = 0.0;
    *sumviol = 0.0;
    uVar4 = (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    while (0 < (int)uVar4) {
      uVar1 = uVar4 - 1;
      dVar5 = SPxLPBase<double>::lowerUnscaled(this->_realLP,uVar4 - 1);
      dVar6 = SPxLPBase<double>::upperUnscaled(this->_realLP,uVar4 - 1);
      pdVar2 = (this->_solReal)._primal.val.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar5 = dVar5 - pdVar2[uVar1];
      if ((0.0 < dVar5) && (*sumviol = *sumviol + dVar5, *maxviol <= dVar5 && dVar5 != *maxviol)) {
        *maxviol = dVar5;
      }
      dVar6 = pdVar2[uVar1] - dVar6;
      uVar4 = uVar1;
      if ((0.0 < dVar6) && (*sumviol = *sumviol + dVar6, *maxviol <= dVar6 && dVar6 != *maxviol)) {
        *maxviol = dVar6;
      }
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}